

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.hpp
# Opt level: O0

void __thiscall Executor::Executor(Executor *this)

{
  Visitor *in_RDI;
  stack<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>_>
  *this_00;
  
  Visitor::Visitor(in_RDI);
  in_RDI->_vptr_Visitor = (_func_int **)&PTR__Executor_002b1538;
  this_00 = (stack<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>_>
             *)(in_RDI + 1);
  std::unique_ptr<Value,std::default_delete<Value>>::unique_ptr<std::default_delete<Value>,void>
            ((unique_ptr<Value,_std::default_delete<Value>_> *)this_00);
  Context::Context((Context *)this);
  std::
  stack<std::unique_ptr<Value,std::default_delete<Value>>,std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>>
  ::
  stack<std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>,void>
            (this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 0x16));
  *(undefined4 *)&in_RDI[0x45]._vptr_Visitor = 0;
  return;
}

Assistant:

Executor(): value_(), context_(), returnStack_(), stdout_(), exitCode_(0) {}